

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# notch.hpp
# Opt level: O2

void __thiscall
notch::core::FullyConnectedLayer::setLearningPolicy(FullyConnectedLayer *this,ALearningPolicy *lp)

{
  unique_ptr<notch::core::ALearningPolicy,_std::default_delete<notch::core::ALearningPolicy>_>
  uStack_18;
  
  (*lp->_vptr_ALearningPolicy[1])(&uStack_18);
  ::std::__shared_ptr<notch::core::ALearningPolicy,(__gnu_cxx::_Lock_policy)2>::operator=
            ((__shared_ptr<notch::core::ALearningPolicy,(__gnu_cxx::_Lock_policy)2> *)&this->policy,
             &uStack_18);
  std::unique_ptr<notch::core::ALearningPolicy,_std::default_delete<notch::core::ALearningPolicy>_>
  ::~unique_ptr(&uStack_18);
  return;
}

Assistant:

virtual void setLearningPolicy(const ALearningPolicy &lp) {
        policy = lp.clone();
    }